

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Player::move(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int a,int b)

{
  int iVar1;
  int iVar2;
  undefined8 local_18;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = b + this->y;
  iVar2 = a + this->x;
  this->x = iVar2;
  this->y = iVar1;
  if (iVar2 < 0) {
    iVar2 = 0;
LAB_00104904:
    this->x = iVar2;
  }
  else if (this->_RANGE <= iVar2) {
    iVar2 = this->_RANGE + -1;
    goto LAB_00104904;
  }
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  else {
    if (iVar1 < this->_RANGE) goto LAB_0010491a;
    iVar1 = this->_RANGE + -1;
  }
  this->y = iVar1;
LAB_0010491a:
  local_18._0_4_ = this->x;
  local_18._4_4_ = this->y;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::move(int a, int b)
{
    std::vector<int> vec;

    this->x += a;
    //std::cout << "x is " << this->x;

    this->y += b;
    //std::cout << " y is " << this->y<<std::endl;

    // this->z += c;
    //  std::cout<<" z is "<<this->z<<std::endl;

    if (this->x < 0)
    {
        this->x = 0;
    }
    else if (this->x > (_RANGE - 1))
    {
        this->x = _RANGE - 1; //Looks good
    }
    if (this->y < 0)
    {
        this->y = 0;
    }
    else if (this->y > (_RANGE - 1))
    {
        this->y = _RANGE - 1;
    }
    /**
    if (this->z < 0)
    {
        this->z = 0;
    }
    else if (this->z > (_RANGE - 1))
    {
        this->z = _RANGE - 1;
    }
    std::cout<<" x is "<<this->x;
    std::cout<<" y is "<<this->y;
    std::cout<<" z is "<<this->z<<std::endl;
    **/
    vec = {this->x, this->y};
    return vec;
}